

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_sse2.c
# Opt level: O2

void highbd_12_variance_sse2
               (uint16_t *src,int src_stride,uint16_t *ref,int ref_stride,int w,int h,uint32_t *sse,
               int *sum,high_variance_fn_t var_fn,int block_size)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  int local_78;
  uint local_74;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  uint16_t *local_48;
  uint16_t *local_40;
  long local_38;
  
  lVar1 = (long)block_size;
  local_38 = (long)w;
  local_58 = (long)h;
  local_68 = src_stride * lVar1 * 2;
  local_60 = ref_stride * lVar1 * 2;
  lVar2 = 0;
  iVar3 = 0;
  local_70 = lVar1;
  for (local_50 = 0; local_50 < local_58; local_50 = local_50 + local_70) {
    local_48 = src;
    local_40 = ref;
    for (lVar4 = 0; lVar4 < local_38; lVar4 = lVar4 + local_70) {
      (*var_fn)(src,src_stride,ref,ref_stride,&local_74,&local_78);
      iVar3 = iVar3 + local_78;
      lVar2 = lVar2 + (ulong)local_74;
      src = src + lVar1;
      ref = ref + lVar1;
    }
    src = (uint16_t *)((long)local_48 + local_68);
    ref = (uint16_t *)((long)local_40 + local_60);
  }
  *sum = iVar3 + 8 >> 4;
  *sse = (uint32_t)((ulong)(lVar2 + 0x80) >> 8);
  return;
}

Assistant:

static void highbd_12_variance_sse2(const uint16_t *src, int src_stride,
                                    const uint16_t *ref, int ref_stride, int w,
                                    int h, uint32_t *sse, int *sum,
                                    high_variance_fn_t var_fn, int block_size) {
  int i, j;
  uint64_t sse_long = 0;
  int32_t sum_long = 0;

  for (i = 0; i < h; i += block_size) {
    for (j = 0; j < w; j += block_size) {
      unsigned int sse0;
      int sum0;
      var_fn(src + src_stride * i + j, src_stride, ref + ref_stride * i + j,
             ref_stride, &sse0, &sum0);
      sse_long += sse0;
      sum_long += sum0;
    }
  }
  *sum = ROUND_POWER_OF_TWO(sum_long, 4);
  *sse = (uint32_t)ROUND_POWER_OF_TWO(sse_long, 8);
}